

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O2

Vec_Wrd_t * Mpm_ManGetTruthWithCnf(int Limit)

{
  Vec_Wrd_t *p;
  long lVar1;
  
  p = Vec_WrdAlloc(1000);
  for (lVar1 = 0x10; lVar1 != 0x4a70; lVar1 = lVar1 + 0x20) {
    if (*(int *)(lVar1 + 0xa9d5e8) <= Limit) {
      Vec_WrdPush(p,*(word *)((long)&s_DsdClass6[0].nVars + lVar1));
    }
  }
  return p;
}

Assistant:

Vec_Wrd_t * Mpm_ManGetTruthWithCnf( int Limit )
{
    Vec_Wrd_t * vRes = Vec_WrdAlloc( 1000 );
    int i;
    for ( i = 0; i < 595; i++ )
        if ( s_DsdClass6[i].nClauses <= Limit )
            Vec_WrdPush( vRes, s_DsdClass6[i].uTruth );
    return vRes;
}